

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

void __thiscall testing::internal::FilePath::Normalize(FilePath *this)

{
  bool bVar1;
  long lVar2;
  char *__s;
  char *local_28;
  char *dest_ptr;
  char *dest;
  char *src;
  FilePath *this_local;
  
  lVar2 = std::__cxx11::string::c_str();
  if (lVar2 == 0) {
    std::__cxx11::string::operator=((string *)this,"");
  }
  else {
    dest = (char *)std::__cxx11::string::c_str();
    lVar2 = std::__cxx11::string::length();
    __s = (char *)operator_new__(lVar2 + 1);
    lVar2 = std::__cxx11::string::length();
    memset(__s,0,lVar2 + 1);
    local_28 = __s;
    while (*dest != '\0') {
      *local_28 = *dest;
      bVar1 = IsPathSeparator(*dest);
      if (bVar1) {
        while (bVar1 = IsPathSeparator(*dest), bVar1) {
          dest = dest + 1;
        }
      }
      else {
        dest = dest + 1;
      }
      local_28 = local_28 + 1;
    }
    *local_28 = '\0';
    std::__cxx11::string::operator=((string *)this,__s);
    if (__s != (char *)0x0) {
      operator_delete__(__s);
    }
  }
  return;
}

Assistant:

void FilePath::Normalize() {
  if (pathname_.c_str() == NULL) {
    pathname_ = "";
    return;
  }
  const char* src = pathname_.c_str();
  char* const dest = new char[pathname_.length() + 1];
  char* dest_ptr = dest;
  memset(dest_ptr, 0, pathname_.length() + 1);

  while (*src != '\0') {
    *dest_ptr = *src;
    if (!IsPathSeparator(*src)) {
      src++;
    } else {
#if GTEST_HAS_ALT_PATH_SEP_
      if (*dest_ptr == kAlternatePathSeparator) {
        *dest_ptr = kPathSeparator;
      }
#endif
      while (IsPathSeparator(*src))
        src++;
    }
    dest_ptr++;
  }
  *dest_ptr = '\0';
  pathname_ = dest;
  delete[] dest;
}